

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvalidator.c
# Opt level: O3

void OutputWarning(int ErrCode,tchar_t *ErrString,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list Args;
  tchar_t Buffer [1024];
  __va_list_tag local_4e8;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  tchar_t local_418 [1032];
  
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  if (Warnings == '\0') {
    local_4e8.reg_save_area = local_4c8;
    local_4e8.overflow_arg_area = &Args[0].overflow_arg_area;
    local_4e8.gp_offset = 0x10;
    local_4e8.fp_offset = 0x30;
    local_4b8 = in_RDX;
    local_4b0 = in_RCX;
    local_4a8 = in_R8;
    local_4a0 = in_R9;
    vstprintf_s(local_418,0x400,ErrString,&local_4e8);
    TextPrintf((textwriter_conflict *)StdErr,"\rWRN%03X: %s\r\n",ErrCode,local_418);
    if (QuickExit == '\x01') {
      exit(-ErrCode);
    }
  }
  return;
}

Assistant:

static void OutputWarning(int ErrCode, const tchar_t *ErrString, ...)
{
    if (Warnings)
    {
        tchar_t Buffer[MAXLINE];
        va_list Args;
        va_start(Args,ErrString);
        vstprintf_s(Buffer,TSIZEOF(Buffer), ErrString, Args);
        va_end(Args);
        TextPrintf(StdErr,T("\rWRN%03X: %s\r\n"),ErrCode,Buffer);
        if (QuickExit)
            exit(-ErrCode);
    }
}